

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::give_every_mirror_a_sample_slow(Mems *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  size_type sVar7;
  pointer pMVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference __x;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_d8;
  Point_d *local_d0;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_c8;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_c0;
  const_iterator local_b8;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_b0;
  int local_a8;
  int local_a4;
  int mi;
  int it;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_98;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_90;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_88;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_80;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_78;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_70;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_68;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_60;
  Point_d *local_58;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_50;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_48;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_40;
  iterator mirror;
  Mems *this_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"give every mirror a sample");
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"\n");
  iVar4 = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
  iVar5 = std::vector<Mirror,_std::allocator<Mirror>_>::end(&this->_mems_mirrors);
  std::
  sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,bool(*)(Mirror_const&,Mirror_const&)>
            ((__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             iVar4._M_current,
             (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             iVar5._M_current,compare_by_ammount_of_matching_samples);
  while( true ) {
    sVar6 = std::vector<Mirror,_std::allocator<Mirror>_>::size
                      (&this->_mems_mirrors_randomrasterized);
    sVar7 = std::vector<Mirror,_std::allocator<Mirror>_>::size(&this->_mems_mirrors);
    if (sVar7 <= sVar6) break;
    iVar4 = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    iVar5 = std::vector<Mirror,_std::allocator<Mirror>_>::end(&this->_mems_mirrors);
    std::
    sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,bool(*)(Mirror_const&,Mirror_const&)>
              ((__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
               iVar4._M_current,
               (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
               iVar5._M_current,compare_by_ammount);
    poVar3 = std::operator<<((ostream *)&std::cout,"Mirror with smallest ammount of samples has  ");
    mirror = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&mirror);
    sVar6 = std::vector<Point_d,_std::allocator<Point_d>_>::size(&pMVar8->_matching_samples);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    poVar3 = std::operator<<(poVar3," samples. ");
    std::operator<<(poVar3,"\n");
    local_40._M_current =
         (Mirror *)std::begin<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
    while( true ) {
      local_48._M_current =
           (Mirror *)std::end<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
      bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
      if (!bVar2) break;
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      local_50._M_current =
           (Point_d *)
           std::vector<Point_d,_std::allocator<Point_d>_>::begin(&pMVar8->_matching_samples);
      pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_40);
      local_58 = (Point_d *)
                 std::vector<Point_d,_std::allocator<Point_d>_>::end(&pMVar8->_matching_samples);
      std::
      sort<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,bool(*)(Point_d_const&,Point_d_const&)>
                (local_50,(__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>
                           )local_58,compare_by_distance);
      __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
      operator++(&local_40);
    }
    local_60._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_60);
    pvVar9 = std::vector<Point_d,_std::allocator<Point_d>_>::front(&pMVar8->_matching_samples);
    local_68._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_68);
    (pMVar8->_displayed_sample).x = pvVar9->x;
    (pMVar8->_displayed_sample).y = pvVar9->y;
    (pMVar8->_displayed_sample).dis = pvVar9->dis;
    (pMVar8->_displayed_sample).id = pvVar9->id;
    local_70._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_70);
    pMVar8->has_sample = true;
    local_78._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_78);
    std::vector<Point_d,_std::allocator<Point_d>_>::clear(&pMVar8->_matching_samples);
    local_80._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_80);
    pMVar8->_ammount_of_matching_samples = 0xd9038;
    poVar3 = std::operator<<((ostream *)&std::cout,"_mems_mirror.begin() on pos: x: ");
    local_88._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_88);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(pMVar8->_position).x);
    poVar3 = std::operator<<(poVar3," y: ");
    local_90._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_90);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(pMVar8->_position).y);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"_mems_mirror.begin() shows now: x: ");
    local_98._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_98);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(pMVar8->_displayed_sample).x);
    poVar3 = std::operator<<(poVar3," y: ");
    _mi = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    pMVar8 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->((__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
                         *)&mi);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(pMVar8->_displayed_sample).y);
    std::operator<<(poVar3,"\n");
    for (local_a4 = 0; sVar6 = (size_type)local_a4,
        sVar7 = std::vector<Mirror,_std::allocator<Mirror>_>::size(&this->_mems_mirrors),
        sVar6 != sVar7; local_a4 = local_a4 + 1) {
      pvVar10 = std::vector<Mirror,_std::allocator<Mirror>_>::operator[]
                          (&this->_mems_mirrors,(long)local_a4);
      if ((pvVar10->has_sample & 1U) == 0) {
        local_a8 = 0;
        pvVar10 = std::vector<Mirror,_std::allocator<Mirror>_>::operator[]
                            (&this->_mems_mirrors,(long)local_a4);
        sVar6 = std::vector<Point_d,_std::allocator<Point_d>_>::size(&pvVar10->_matching_samples);
        if (sVar6 != 0) {
          local_b0._M_current =
               (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
          pMVar8 = __gnu_cxx::
                   __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
                   operator->(&local_b0);
          iVar1 = (pMVar8->_displayed_sample).id;
          pvVar10 = std::vector<Mirror,_std::allocator<Mirror>_>::operator[]
                              (&this->_mems_mirrors,(long)local_a4);
          pvVar9 = std::vector<Point_d,_std::allocator<Point_d>_>::operator[]
                             (&pvVar10->_matching_samples,(long)local_a8);
          if (iVar1 == pvVar9->id) {
            pvVar10 = std::vector<Mirror,_std::allocator<Mirror>_>::operator[]
                                (&this->_mems_mirrors,(long)local_a4);
            pvVar11 = std::vector<Mirror,_std::allocator<Mirror>_>::operator[]
                                (&this->_mems_mirrors,(long)local_a4);
            local_c8._M_current =
                 (Point_d *)
                 std::vector<Point_d,_std::allocator<Point_d>_>::begin(&pvVar11->_matching_samples);
            local_c0 = __gnu_cxx::
                       __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>
                       ::operator+(&local_c8,(long)local_a8);
            __gnu_cxx::
            __normal_iterator<Point_d_const*,std::vector<Point_d,std::allocator<Point_d>>>::
            __normal_iterator<Point_d*>
                      ((__normal_iterator<Point_d_const*,std::vector<Point_d,std::allocator<Point_d>>>
                        *)&local_b8,&local_c0);
            local_d0 = (Point_d *)
                       std::vector<Point_d,_std::allocator<Point_d>_>::erase
                                 (&pvVar10->_matching_samples,local_b8);
            std::operator<<((ostream *)&std::cout,"sample erased  ");
          }
        }
      }
    }
    local_d8._M_current =
         (Mirror *)std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
    __x = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
          operator*(&local_d8);
    std::vector<Mirror,_std::allocator<Mirror>_>::push_back
              (&this->_mems_mirrors_randomrasterized,__x);
    poVar3 = std::operator<<((ostream *)&std::cout,"new mirrorvector has size: ");
    sVar6 = std::vector<Mirror,_std::allocator<Mirror>_>::size
                      (&this->_mems_mirrors_randomrasterized);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"\n");
  }
  iVar4 = std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors);
  iVar5 = std::vector<Mirror,_std::allocator<Mirror>_>::end(&this->_mems_mirrors);
  std::
  sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,bool(*)(Mirror_const&,Mirror_const&)>
            ((__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             iVar4._M_current,
             (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>)
             iVar5._M_current,compare_by_idi);
  poVar3 = std::operator<<((ostream *)&std::cout,"give every mirror a sample ends now. ");
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void Mems::give_every_mirror_a_sample_slow(){
      std::cout<<"\n";

      std::cout<<"give every mirror a sample"<< "\n"<< "\n";
      std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount_of_matching_samples);

      while(_mems_mirrors_randomrasterized.size() < _mems_mirrors.size())
      {
  //      std::cout<<"Pixels left: "<<_mems_mirrors.size()<<"\n";
        //sorting mems for sample availability
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount);

        std::cout << "Mirror with smallest ammount of samples has  " <<_mems_mirrors.begin()->_matching_samples.size()<<" samples. " <<"\n";
        //gehe durch alle spiegel und sortiere ihren sample vector der größe nach
        for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
        {
          std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
        }

        // give first mirror(am wenigsten matches) sample_displayed which is at matching samples first position
        _mems_mirrors.begin()->_displayed_sample = _mems_mirrors.begin()->_matching_samples.front();
        _mems_mirrors.begin()->has_sample = true;
        _mems_mirrors.begin()->_matching_samples.clear();
        _mems_mirrors.begin()->_ammount_of_matching_samples = 888888;
        std::cout<<"_mems_mirror.begin() on pos: x: "<<_mems_mirrors.begin()->_position.x<<" y: "<<_mems_mirrors.begin()->_position.y<<"\n";
        std::cout<<"_mems_mirror.begin() shows now: x: "<<_mems_mirrors.begin()->_displayed_sample.x<<" y: "<<_mems_mirrors.begin()->_displayed_sample.y<<"\n";

        //point aus allen umliegenden mirrors als available point löschen

        for(int it = 0; it != _mems_mirrors.size(); ++it){
          //std::cout<<"mi erased0  ";
          if(_mems_mirrors[it].has_sample == false){

            for(int mi = 0; mi != _mems_mirrors[it]._matching_samples.size(); ++mi){

              if(_mems_mirrors.begin()->_displayed_sample.id == _mems_mirrors[it]._matching_samples[mi].id){
              /*  std::cout<< "matching samples size before erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id of sample "<<"\n";
                }
                */
                _mems_mirrors[it]._matching_samples.erase(_mems_mirrors[it]._matching_samples.begin()+ mi);
              //  it->_ammount_of_matching_samples = it->_matching_samples.size();
                std::cout<<"sample erased  ";

              /*  std::cout<< "matching samples size after erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id "<<"\n";
                }
                */
              }
              break;
            }
          }
        }
        _mems_mirrors_randomrasterized.push_back(*_mems_mirrors.begin());
        std::cout<<"new mirrorvector has size: "<<_mems_mirrors_randomrasterized.size()<<"\n"<<"\n"<<"\n"<<"\n";

        }
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_idi);
        std::cout<<"give every mirror a sample ends now. "<<"\n";


      }